

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O3

void hpa_dalloc(tsdn_t *tsdn,pai_t *self,edata_t *edata,_Bool *deferred_work_generated)

{
  edata_list_active_t local_8;
  
  (edata->field_5).ql_link_active.qre_next = edata;
  (edata->field_5).ql_link_active.qre_prev = edata;
  local_8.head.qlh_first =
       (anon_struct_8_1_803fbc3e_for_head)(anon_struct_8_1_803fbc3e_for_head)edata;
  hpa_dalloc_batch(tsdn,self,&local_8,deferred_work_generated);
  return;
}

Assistant:

static void
hpa_dalloc(tsdn_t *tsdn, pai_t *self, edata_t *edata,
    bool *deferred_work_generated) {
	assert(!edata_guarded_get(edata));
	/* Just a dalloc_batch of size 1; this lets us share logic. */
	edata_list_active_t dalloc_list;
	edata_list_active_init(&dalloc_list);
	edata_list_active_append(&dalloc_list, edata);
	hpa_dalloc_batch(tsdn, self, &dalloc_list, deferred_work_generated);
}